

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O2

void __thiscall
TCLAP::ArgParseException::ArgParseException(ArgParseException *this,string *text,string *id)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Exception found while parsing ",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"the value the Arg has been passed.",&local_7a);
  std::operator+(&local_38,&local_58,&local_78);
  ArgException::ArgException(&this->super_ArgException,text,id,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)&this->super_ArgException = &PTR__ArgException_00124be8;
  return;
}

Assistant:

ArgParseException( const std::string& text = "undefined exception", 
					       const std::string& id = "undefined" )
			: ArgException( text, 
			                id, 
							std::string( "Exception found while parsing " ) + 
							std::string( "the value the Arg has been passed." ))
			{ }